

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxmlparser.cpp
# Opt level: O0

char * __thiscall
despot::util::tinyxml::TiXmlElement::Parse
          (TiXmlElement *this,char *p,TiXmlParsingData *data,TiXmlEncoding encoding)

{
  int iVar1;
  char *pcVar2;
  TiXmlDocument *doc;
  TiXmlCursor *pTVar3;
  Rep *pRVar4;
  char *tag;
  size_type sVar5;
  TiXmlAttribute *this_00;
  undefined4 extraout_var;
  TiXmlAttribute *this_01;
  bool bVar6;
  TiXmlAttribute *node;
  TiXmlAttribute *attrib;
  TiXmlString local_48;
  TiXmlString endTag;
  char *pErr;
  TiXmlDocument *document;
  TiXmlEncoding encoding_local;
  TiXmlParsingData *data_local;
  char *p_local;
  TiXmlElement *this_local;
  
  pcVar2 = TiXmlBase::SkipWhiteSpace(p,encoding);
  doc = TiXmlNode::GetDocument(&this->super_TiXmlNode);
  if ((pcVar2 == (char *)0x0) || (*pcVar2 == '\0')) {
    if (doc != (TiXmlDocument *)0x0) {
      TiXmlDocument::SetError(doc,4,(char *)0x0,(TiXmlParsingData *)0x0,encoding);
    }
    this_local = (TiXmlElement *)0x0;
  }
  else {
    if (data != (TiXmlParsingData *)0x0) {
      TiXmlParsingData::Stamp(data,pcVar2,encoding);
      pTVar3 = TiXmlParsingData::Cursor(data);
      (this->super_TiXmlNode).super_TiXmlBase.location = *pTVar3;
    }
    if (*pcVar2 == '<') {
      endTag.rep_ = (Rep *)TiXmlBase::SkipWhiteSpace(pcVar2 + 1,encoding);
      data_local = (TiXmlParsingData *)
                   TiXmlBase::ReadName((char *)endTag.rep_,&(this->super_TiXmlNode).value,encoding);
      if ((data_local == (TiXmlParsingData *)0x0) || ((char)(data_local->cursor).row == '\0')) {
        if (doc != (TiXmlDocument *)0x0) {
          TiXmlDocument::SetError(doc,5,(char *)endTag.rep_,data,encoding);
        }
        this_local = (TiXmlElement *)0x0;
      }
      else {
        TiXmlString::TiXmlString(&local_48,"</");
        TiXmlString::operator+=(&local_48,&(this->super_TiXmlNode).value);
        TiXmlString::operator+=(&local_48,">");
        while( true ) {
          bVar6 = false;
          if (data_local != (TiXmlParsingData *)0x0) {
            bVar6 = (char)(data_local->cursor).row != '\0';
          }
          if (!bVar6) {
            this_local = (TiXmlElement *)data_local;
            goto LAB_002329bd;
          }
          endTag.rep_ = (Rep *)data_local;
          pRVar4 = (Rep *)TiXmlBase::SkipWhiteSpace((char *)data_local,encoding);
          if ((pRVar4 == (Rep *)0x0) || ((char)pRVar4->size == '\0')) {
            if (doc != (TiXmlDocument *)0x0) {
              TiXmlDocument::SetError(doc,7,(char *)endTag.rep_,data,encoding);
            }
            this_local = (TiXmlElement *)0x0;
            goto LAB_002329bd;
          }
          if ((char)pRVar4->size == '/') {
            pcVar2 = (char *)((long)&pRVar4->size + 1);
            if (*pcVar2 == '>') {
              this_local = (TiXmlElement *)((long)&pRVar4->size + 2);
            }
            else {
              if (doc != (TiXmlDocument *)0x0) {
                TiXmlDocument::SetError(doc,8,pcVar2,data,encoding);
              }
              this_local = (TiXmlElement *)0x0;
            }
            goto LAB_002329bd;
          }
          if ((char)pRVar4->size == '>') {
            pcVar2 = ReadValue(this,(char *)((long)&pRVar4->size + 1),data,encoding);
            if ((pcVar2 == (char *)0x0) || (*pcVar2 == '\0')) {
              if (doc != (TiXmlDocument *)0x0) {
                TiXmlDocument::SetError(doc,9,pcVar2,data,encoding);
              }
              this_local = (TiXmlElement *)0x0;
            }
            else {
              tag = TiXmlString::c_str(&local_48);
              bVar6 = TiXmlBase::StringEqual(pcVar2,tag,false,encoding);
              if (bVar6) {
                sVar5 = TiXmlString::length(&local_48);
                this_local = (TiXmlElement *)(pcVar2 + sVar5);
              }
              else {
                if (doc != (TiXmlDocument *)0x0) {
                  TiXmlDocument::SetError(doc,9,pcVar2,data,encoding);
                }
                this_local = (TiXmlElement *)0x0;
              }
            }
            goto LAB_002329bd;
          }
          this_00 = (TiXmlAttribute *)operator_new(0x40);
          TiXmlAttribute::TiXmlAttribute(this_00);
          if (this_00 == (TiXmlAttribute *)0x0) {
            if (doc != (TiXmlDocument *)0x0) {
              TiXmlDocument::SetError(doc,3,(char *)endTag.rep_,data,encoding);
            }
            this_local = (TiXmlElement *)0x0;
            goto LAB_002329bd;
          }
          TiXmlAttribute::SetDocument(this_00,doc);
          endTag.rep_ = pRVar4;
          iVar1 = (*(this_00->super_TiXmlBase)._vptr_TiXmlBase[3])
                            (this_00,pRVar4,data,(ulong)encoding);
          data_local = (TiXmlParsingData *)CONCAT44(extraout_var,iVar1);
          if ((data_local == (TiXmlParsingData *)0x0) || ((char)(data_local->cursor).row == '\0')) {
            if (doc != (TiXmlDocument *)0x0) {
              TiXmlDocument::SetError(doc,4,(char *)endTag.rep_,data,encoding);
            }
            if (this_00 != (TiXmlAttribute *)0x0) {
              (*(this_00->super_TiXmlBase)._vptr_TiXmlBase[1])();
            }
            this_local = (TiXmlElement *)0x0;
            goto LAB_002329bd;
          }
          pcVar2 = TiXmlAttribute::Name(this_00);
          this_01 = TiXmlAttributeSet::Find(&this->attributeSet,pcVar2);
          if (this_01 != (TiXmlAttribute *)0x0) break;
          TiXmlAttributeSet::Add(&this->attributeSet,this_00);
        }
        pcVar2 = TiXmlAttribute::Value(this_00);
        TiXmlAttribute::SetValue(this_01,pcVar2);
        if (this_00 != (TiXmlAttribute *)0x0) {
          (*(this_00->super_TiXmlBase)._vptr_TiXmlBase[1])();
        }
        this_local = (TiXmlElement *)0x0;
LAB_002329bd:
        TiXmlString::~TiXmlString(&local_48);
      }
    }
    else {
      if (doc != (TiXmlDocument *)0x0) {
        TiXmlDocument::SetError(doc,4,pcVar2,data,encoding);
      }
      this_local = (TiXmlElement *)0x0;
    }
  }
  return (char *)this_local;
}

Assistant:

const char* TiXmlElement::Parse(const char* p, TiXmlParsingData* data,
	TiXmlEncoding encoding) {
	p = SkipWhiteSpace(p, encoding);
	TiXmlDocument* document = GetDocument();

	if (!p || !*p) {
		if (document)
			document->SetError(TIXML_ERROR_PARSING_ELEMENT, 0, 0, encoding);
		return 0;
	}

	if (data) {
		data->Stamp(p, encoding);
		location = data->Cursor();
	}

	if (*p != '<') {
		if (document)
			document->SetError(TIXML_ERROR_PARSING_ELEMENT, p, data, encoding);
		return 0;
	}

	p = SkipWhiteSpace(p + 1, encoding);

	// Read the name.
	const char* pErr = p;

	p = ReadName(p, &value, encoding);
	if (!p || !*p) {
		if (document)
			document->SetError(TIXML_ERROR_FAILED_TO_READ_ELEMENT_NAME, pErr,
				data, encoding);
		return 0;
	}
	TIXML_STRING endTag("</");
	endTag += value;
	endTag += ">";

	// Check for and read attributes. Also look for an empty
	// tag or an end tag.
	while (p && *p) {
		pErr = p;
		p = SkipWhiteSpace(p, encoding);
		if (!p || !*p) {
			if (document)
				document->SetError(TIXML_ERROR_READING_ATTRIBUTES, pErr, data,
					encoding);
			return 0;
		}
		if (*p == '/') {
			++p;
			// Empty tag.
			if (*p != '>') {
				if (document)
					document->SetError(TIXML_ERROR_PARSING_EMPTY, p, data,
						encoding);
				return 0;
			}
			return (p + 1);
		} else if (*p == '>') {
			// Done with attributes (if there were any.)
			// Read the value -- which can include other
			// elements -- read the end tag, and return.
			++p;
			p = ReadValue(p, data, encoding); // Note this is an Element method, and will set the error if one happens.
			if (!p || !*p) {
				// We were looking for the end tag, but found nothing.
				// Fix for [ 1663758 ] Failure to report error on bad XML
				if (document)
					document->SetError(TIXML_ERROR_READING_END_TAG, p, data,
						encoding);
				return 0;
			}

			// We should find the end tag now
			if (StringEqual(p, endTag.c_str(), false, encoding)) {
				p += endTag.length();
				return p;
			} else {
				if (document)
					document->SetError(TIXML_ERROR_READING_END_TAG, p, data,
						encoding);
				return 0;
			}
		} else {
			// Try to read an attribute:
			TiXmlAttribute* attrib = new TiXmlAttribute();
			if (!attrib) {
				if (document)
					document->SetError(TIXML_ERROR_OUT_OF_MEMORY, pErr, data,
						encoding);
				return 0;
			}

			attrib->SetDocument(document);
			pErr = p;
			p = attrib->Parse(p, data, encoding);

			if (!p || !*p) {
				if (document)
					document->SetError(TIXML_ERROR_PARSING_ELEMENT, pErr, data,
						encoding);
				delete attrib;
				return 0;
			}

			// Handle the strange case of double attributes:
#ifdef TIXML_USE_STL
			TiXmlAttribute* node = attributeSet.Find( attrib->NameTStr() );
#else
			TiXmlAttribute* node = attributeSet.Find(attrib->Name());
#endif
			if (node) {
				node->SetValue(attrib->Value());
				delete attrib;
				return 0;
			}

			attributeSet.Add(attrib);
		}
	}
	return p;
}